

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall libtorrent::aux::torrent::lsd_announce(torrent *this)

{
  info_hash_t *this_00;
  byte bVar1;
  element_type *peVar2;
  session_interface *psVar3;
  bool bVar4;
  ushort uVar5;
  int iVar6;
  undefined4 extraout_var;
  ulong uVar7;
  uint local_38;
  uint uStack_34;
  uint uStack_30;
  uint uStack_2c;
  uint local_28;
  
  uVar7 = *(ulong *)&(this->super_torrent_hot_members).field_0x48;
  if (((uint)uVar7 >> 0x1a & 1) == 0) {
    if ((this->field_0x5cc & 0x40) != 0) {
      bVar1 = this->field_0x5c0;
      if ((bVar1 & 8) == 0) {
        if ((bVar1 & 2) == 0) {
          return;
        }
        if (0 < (((this->super_torrent_hot_members).m_torrent_file.
                  super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                m_files).m_piece_length) {
          return;
        }
      }
      else {
        if ((bVar1 & 2) == 0) {
          return;
        }
        peVar2 = (this->super_torrent_hot_members).m_torrent_file.
                 super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if ((0 < (peVar2->m_files).m_piece_length) && (((peVar2->m_flags).m_val & 2) != 0)) {
          return;
        }
      }
      if ((char)this->field_0x5cc < '\0') {
        iVar6 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                  _vptr_session_logger[0x2e])();
        bVar4 = session_settings::get_bool((session_settings *)CONCAT44(extraout_var,iVar6),0x8017);
        if (!bVar4) {
          return;
        }
        uVar7 = *(ulong *)&(this->super_torrent_hot_members).field_0x48;
      }
      if (((uVar7 & 0x18000000) == 0) &&
         (iVar6 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                    _vptr_session_logger[0x3d])(), (char)iVar6 != '\0')) {
        uVar5 = (**(code **)((long)(((this->super_torrent_hot_members).m_ses)->super_session_logger)
                                   ._vptr_session_logger +
                            (ulong)(*(uint *)&this->field_0x5dd >> 0x16 & 8) + 0x100))();
        peVar2 = (this->super_torrent_hot_members).m_torrent_file.
                 super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        this_00 = &peVar2->m_info_hash;
        bVar4 = info_hash_t::has_v1(this_00);
        if (bVar4) {
          psVar3 = (this->super_torrent_hot_members).m_ses;
          (*(psVar3->super_session_logger)._vptr_session_logger[0x3e])(psVar3,this_00,(ulong)uVar5);
        }
        bVar4 = info_hash_t::has_v2(this_00);
        if (bVar4) {
          local_28 = (peVar2->m_info_hash).v2.m_number._M_elems[4];
          local_38 = (peVar2->m_info_hash).v2.m_number._M_elems[0];
          uStack_34 = (peVar2->m_info_hash).v2.m_number._M_elems[1];
          uStack_30 = (peVar2->m_info_hash).v2.m_number._M_elems[2];
          uStack_2c = (peVar2->m_info_hash).v2.m_number._M_elems[3];
          psVar3 = (this->super_torrent_hot_members).m_ses;
          (*(psVar3->super_session_logger)._vptr_session_logger[0x3e])
                    (psVar3,&local_38,(ulong)uVar5);
        }
      }
    }
  }
  return;
}

Assistant:

void torrent::lsd_announce()
	{
		if (m_abort) return;
		if (!m_enable_lsd) return;

		// if the files haven't been checked yet, we're
		// not ready for peers. Except, if we don't have metadata,
		// we need peers to download from
		if (!m_files_checked && valid_metadata()) return;

		if (!m_announce_to_lsd) return;

		// private torrents are never announced on LSD
		if (m_torrent_file->is_valid() && m_torrent_file->priv()) return;

#if TORRENT_USE_I2P
		// i2p torrents are also never announced on LSD
		// unless we allow mixed swarms
		if (is_i2p() && !settings().get_bool(settings_pack::allow_i2p_mixed))
			return;
#endif

		if (is_paused()) return;

		if (!m_ses.has_lsd()) return;

		// TODO: this pattern is repeated in a few places. Factor this into
		// a function and generalize the concept of a torrent having a
		// dedicated listen port
#ifdef TORRENT_SSL_PEERS
		int port = is_ssl_torrent() ? m_ses.ssl_listen_port() : m_ses.listen_port();
#else
		int port = m_ses.listen_port();
#endif

		// announce with the local discovery service
		m_torrent_file->info_hashes().for_each([&](sha1_hash const& ih, protocol_version)
		{
			m_ses.announce_lsd(ih, port);
		});
	}